

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week5-app1.cpp
# Opt level: O1

void print(Date *date)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if (date->month == 0) {
LAB_001012c5:
    if (date->year != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,date->year);
      pcVar3 = ")";
      goto LAB_001012f9;
    }
    pcVar3 = "<Uninitialized>";
    lVar2 = 0xf;
    poVar1 = (ostream *)&std::cout;
  }
  else {
    if (date->day != 0) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,date->year);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->month);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->day);
      goto LAB_0010131e;
    }
    if (date->month == 0) goto LAB_001012c5;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,date->year);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,date->month);
    pcVar3 = "]";
LAB_001012f9:
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
LAB_0010131e:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print(const Date& date)
{
    if(date.month != 0 && date.day != 0)
        std::cout << date.year << "-" << date.month << "-" << date.day << std::endl;
    else if(date.month != 0)
        std::cout << "[" << date.year << "-" << date.month << "]" << std::endl;
    else if(date.year)
        std::cout << "(" << date.year << ")" << std::endl;
    else
        std::cout << "<Uninitialized>" << std::endl;
}